

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_config.cc
# Opt level: O1

bool __thiscall flyd::Config::Load(Config *this,char *pconfName)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  __hashtable *__h;
  string item_name;
  string item_content;
  char linebuf [501];
  string local_2a8;
  string local_288;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_268;
  byte local_228 [504];
  
  __stream = fopen(pconfName,"r");
  if (__stream != (FILE *)0x0) {
    iVar1 = feof(__stream);
    if (iVar1 == 0) {
      do {
        pcVar2 = fgets((char *)local_228,500,__stream);
        if (((local_228[0] != 0 && pcVar2 != (char *)0x0) &&
            (((0x3b < local_228[0] - 0x20 ||
              ((0x800000008000009U >> ((ulong)(local_228[0] - 0x20) & 0x3f) & 1) == 0)) &&
             (1 < local_228[0] - 9)))) &&
           (pcVar2 = strchr((char *)local_228,0x3d), pcVar2 != (char *)0x0)) {
          local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
          local_2a8._M_string_length = 0;
          local_2a8.field_2._M_local_buf[0] = '\0';
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          local_288._M_string_length = 0;
          local_288.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::append((char *)&local_2a8,(ulong)local_228);
          std::__cxx11::string::append((char *)&local_288);
          Trim(&local_2a8);
          std::__cxx11::string::_M_assign((string *)&local_2a8);
          Trim(&local_288);
          std::__cxx11::string::_M_assign((string *)&local_288);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    (&local_268,&local_2a8,&local_288);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)this,&local_268);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268.second._M_dataplus._M_p != &local_268.second.field_2) {
            operator_delete(local_268.second._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268.first._M_dataplus._M_p != &local_268.first.field_2) {
            operator_delete(local_268.first._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p);
          }
        }
        iVar1 = feof(__stream);
      } while (iVar1 == 0);
    }
    fclose(__stream);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool Config::Load(const char *pconfName)
{
    FILE *fp;
    fp = fopen(pconfName, "r");
    if(fp == NULL) {
        return false;
    }
    //每一行配置文件读出来都放在这里
    char linebuf[501];//每行配置都不要太长，保持<500字符
    //文件成功打开
    while(!feof(fp)) //检查文件是否结束
    {
        if(fgets(linebuf, 500, fp) == NULL)//从文件中读出一行,若空则重新读
            continue;

        if(linebuf[0] == 0)
            continue;

        //处理注释行
        if(*linebuf == ';' || *linebuf == ' '
        || *linebuf == '#' || *linebuf == '\t' || *linebuf == '\n')
            continue;

        if(linebuf[0] == 0)
            continue;
        if(*linebuf == '[')
            continue;

        //开始处理实际有效的配置文件
        char *ptmp = strchr(linebuf, '=');//获得“=”的地址
        if(ptmp != NULL)
        {
            std::string item_name, item_content;

            item_name.append(linebuf, (int)(ptmp - linebuf));
            item_content.append(ptmp + 1);
            item_name = Trim(item_name);
            item_content = Trim(item_content);

            config_map_.insert({item_name, item_content});
        }
    }  //end while(!feof(fp))
    ::fclose(fp);
    return true;
}